

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arun.cpp
# Opt level: O1

transformation_t *
opengv::math::arun_complete(transformation_t *__return_storage_ptr__,points_t *p1,points_t *p2)

{
  long *plVar1;
  double *pdVar2;
  undefined8 *puVar3;
  double dVar4;
  pointer pMVar5;
  byte bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  ulong uVar13;
  undefined8 uVar14;
  long lVar15;
  Index size;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  pointer pMVar19;
  double *pdVar20;
  ulong uVar21;
  Index outer;
  long lVar22;
  Index alignedEnd;
  ulong uVar23;
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  double dVar31;
  undefined1 auVar32 [16];
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 in_ZMM5 [64];
  MatrixXd Hcross;
  rotation_t rotation;
  Vector3d f;
  DenseStorage<double,__1,__1,__1,_0> local_138;
  undefined1 local_118 [16];
  double local_108;
  undefined8 uStack_100;
  undefined1 local_f8 [16];
  long local_e8;
  points_t *local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [32];
  long lStack_98;
  double local_90;
  undefined1 local_88 [16];
  double local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  double local_38;
  
  auVar32 = in_ZMM5._0_16_;
  pMVar19 = (p1->
            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pMVar5 = (p1->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar22 = ((long)pMVar5 - (long)pMVar19 >> 3) * -0x5555555555555555;
  if (pMVar5 == pMVar19) {
    dVar31 = 0.0;
    local_108 = 0.0;
    local_118._0_8_ = 0.0;
    local_118._8_8_ = 0.0;
    local_f8._0_8_ = 0.0;
    local_f8._8_8_ = 0.0;
  }
  else {
    pMVar5 = (p2->
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar15 = lVar22 + (ulong)(lVar22 == 0);
    local_f8._0_8_ = 0.0;
    local_f8._8_8_ = 0.0;
    local_108 = 0.0;
    lVar17 = 0x10;
    dVar31 = 0.0;
    local_118._0_8_ = 0.0;
    local_118._8_8_ = 0.0;
    do {
      pdVar2 = (double *)
               ((long)(pMVar19->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                      m_storage.m_data.array + lVar17 + -0x10);
      local_f8._0_8_ = (double)local_f8._0_8_ + *pdVar2;
      local_f8._8_8_ = (double)local_f8._8_8_ + pdVar2[1];
      dVar31 = dVar31 + *(double *)
                         ((long)(pMVar19->
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                m_storage.m_data.array + lVar17);
      pdVar2 = (double *)
               ((long)&(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data + lVar17 + -0x10);
      local_118._0_8_ = (double)local_118._0_8_ + *pdVar2;
      local_118._8_8_ = (double)local_118._8_8_ + pdVar2[1];
      local_108 = local_108 +
                  *(double *)
                   ((long)&(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                           m_storage.m_data + lVar17);
      lVar17 = lVar17 + 0x18;
      lVar15 = lVar15 + -1;
    } while (lVar15 != 0);
  }
  pMVar19 = (p2->
            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  pMVar5 = (p2->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_138.m_data = (double *)0x0;
  local_138.m_rows = 0;
  local_138.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_138,9,3,3);
  local_e0 = p2;
  if ((local_138.m_rows != 3) || (local_138.m_cols != 3)) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_138,9,3,3);
  }
  pdVar2 = local_138.m_data;
  local_c8 = vcvtusi2sd_avx512f(auVar32,lVar22);
  local_d8 = vcvtusi2sd_avx512f(auVar32,((long)pMVar19 - (long)pMVar5 >> 3) * -0x5555555555555555);
  uVar16 = local_138.m_rows * local_138.m_cols;
  uVar18 = uVar16 + 7;
  if (-1 < (long)uVar16) {
    uVar18 = uVar16;
  }
  uVar23 = uVar18 & 0xfffffffffffffff8;
  if (7 < (long)uVar16) {
    uVar21 = 8;
    if (8 < (long)uVar23) {
      uVar21 = uVar23;
    }
    memset(local_138.m_data,0,uVar21 * 8);
  }
  auVar34._8_8_ = local_c8._0_8_;
  auVar34._0_8_ = local_c8._0_8_;
  auVar32._8_8_ = local_d8._0_8_;
  auVar32._0_8_ = local_d8._0_8_;
  lVar15 = (long)uVar18 >> 3;
  lVar22 = (long)uVar16 % 8;
  dVar30 = (double)local_c8._0_8_;
  dVar33 = (double)local_d8._0_8_;
  if (lVar22 != 0 && (long)uVar23 <= (long)uVar16) {
    local_e8 = lVar22;
    local_68 = auVar34;
    local_58 = auVar32;
    memset(pdVar2 + lVar15 * 8,0,uVar16 * 8 + lVar15 * -0x40);
    lVar22 = local_e8;
    dVar30 = (double)local_c8._0_8_;
    dVar33 = (double)local_d8._0_8_;
    auVar32 = local_58;
    auVar34 = local_68;
  }
  local_f8 = vdivpd_avx(local_f8,auVar34);
  local_118 = vdivpd_avx(local_118,auVar32);
  local_108 = local_108 / dVar33;
  uStack_100 = 0;
  pMVar19 = (p1->
            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((p1->
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pMVar19) {
    auVar24 = vpbroadcastq_avx512f();
    uVar18 = 0;
    auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      local_48 = vsubpd_avx(*(undefined1 (*) [16])
                             pMVar19[uVar18].
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                             m_data.array,local_f8);
      local_38 = pMVar19[uVar18].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[2] - dVar31 / dVar30;
      pMVar19 = (local_e0->
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      auVar32 = vsubpd_avx(*(undefined1 (*) [16])
                            &pMVar19[uVar18].
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                             m_data,local_118);
      dVar33 = *(double *)
                ((long)&pMVar19[uVar18].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                        .m_storage.m_data + 0x10);
      lVar17 = 0;
      pdVar20 = (double *)(local_b8 + 0x10);
      do {
        dVar4 = *(double *)(local_48 + lVar17 * 8);
        pdVar20[-2] = auVar32._0_8_ * dVar4;
        pdVar20[-1] = auVar32._8_8_ * dVar4;
        *pdVar20 = (dVar33 - local_108) * dVar4;
        lVar17 = lVar17 + 1;
        pdVar20 = pdVar20 + 3;
      } while (lVar17 != 3);
      if (7 < (long)uVar16) {
        lVar17 = 0;
        do {
          auVar26 = vaddpd_avx512f(*(undefined1 (*) [64])(local_b8 + lVar17 * 8),
                                   *(undefined1 (*) [64])(pdVar2 + lVar17));
          *(undefined1 (*) [64])(pdVar2 + lVar17) = auVar26;
          lVar17 = lVar17 + 8;
        } while (lVar17 < (long)uVar23);
      }
      if ((long)uVar16 % 8 != 0 && (long)uVar23 <= (long)uVar16) {
        uVar21 = 0;
        do {
          auVar26 = vpbroadcastq_avx512f();
          auVar26 = vporq_avx512f(auVar26,auVar25);
          uVar13 = vpcmpuq_avx512f(auVar26,auVar24,2);
          plVar1 = (long *)(local_b8 + uVar21 * 8 + lVar15 * 0x40);
          bVar6 = (byte)uVar13;
          auVar26._8_8_ = (ulong)((byte)(uVar13 >> 1) & 1) * plVar1[1];
          auVar26._0_8_ = (ulong)(bVar6 & 1) * *plVar1;
          auVar26._16_8_ = (ulong)((byte)(uVar13 >> 2) & 1) * plVar1[2];
          auVar26._24_8_ = (ulong)((byte)(uVar13 >> 3) & 1) * plVar1[3];
          auVar26._32_8_ = (ulong)((byte)(uVar13 >> 4) & 1) * plVar1[4];
          auVar26._40_8_ = (ulong)((byte)(uVar13 >> 5) & 1) * plVar1[5];
          auVar26._48_8_ = (ulong)((byte)(uVar13 >> 6) & 1) * plVar1[6];
          auVar26._56_8_ = (uVar13 >> 7) * plVar1[7];
          pdVar20 = pdVar2 + lVar15 * 8 + uVar21;
          auVar27._8_8_ = (ulong)((byte)(uVar13 >> 1) & 1) * (long)pdVar20[1];
          auVar27._0_8_ = (ulong)(bVar6 & 1) * (long)*pdVar20;
          auVar27._16_8_ = (ulong)((byte)(uVar13 >> 2) & 1) * (long)pdVar20[2];
          auVar27._24_8_ = (ulong)((byte)(uVar13 >> 3) & 1) * (long)pdVar20[3];
          auVar27._32_8_ = (ulong)((byte)(uVar13 >> 4) & 1) * (long)pdVar20[4];
          auVar27._40_8_ = (ulong)((byte)(uVar13 >> 5) & 1) * (long)pdVar20[5];
          auVar27._48_8_ = (ulong)((byte)(uVar13 >> 6) & 1) * (long)pdVar20[6];
          auVar27._56_8_ = (uVar13 >> 7) * (long)pdVar20[7];
          auVar26 = vaddpd_avx512f(auVar26,auVar27);
          pdVar20 = pdVar2 + lVar15 * 8 + uVar21;
          bVar7 = (bool)((byte)(uVar13 >> 1) & 1);
          bVar8 = (bool)((byte)(uVar13 >> 2) & 1);
          bVar9 = (bool)((byte)(uVar13 >> 3) & 1);
          bVar10 = (bool)((byte)(uVar13 >> 4) & 1);
          bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
          bVar12 = (bool)((byte)(uVar13 >> 6) & 1);
          *pdVar20 = (double)((ulong)(bVar6 & 1) * auVar26._0_8_ |
                             (ulong)!(bool)(bVar6 & 1) * (long)*pdVar20);
          pdVar20[1] = (double)((ulong)bVar7 * auVar26._8_8_ | (ulong)!bVar7 * (long)pdVar20[1]);
          pdVar20[2] = (double)((ulong)bVar8 * auVar26._16_8_ | (ulong)!bVar8 * (long)pdVar20[2]);
          pdVar20[3] = (double)((ulong)bVar9 * auVar26._24_8_ | (ulong)!bVar9 * (long)pdVar20[3]);
          pdVar20[4] = (double)((ulong)bVar10 * auVar26._32_8_ | (ulong)!bVar10 * (long)pdVar20[4]);
          pdVar20[5] = (double)((ulong)bVar11 * auVar26._40_8_ | (ulong)!bVar11 * (long)pdVar20[5]);
          pdVar20[6] = (double)((ulong)bVar12 * auVar26._48_8_ | (ulong)!bVar12 * (long)pdVar20[6]);
          pdVar20[7] = (double)((uVar13 >> 7) * auVar26._56_8_ |
                               (ulong)!SUB81(uVar13 >> 7,0) * (long)pdVar20[7]);
          uVar21 = uVar21 + 8;
        } while ((lVar22 + 7U & 0xfffffffffffffff8) != uVar21);
      }
      uVar18 = uVar18 + 1;
      pMVar19 = (p1->
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar18 < (ulong)(((long)(p1->
                                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar19 >>
                              3) * -0x5555555555555555));
  }
  arun((rotation_t *)local_b8,(MatrixXd *)&local_138);
  dVar33 = local_118._0_8_;
  auVar28._0_8_ = dVar33 * (double)local_b8._0_8_;
  auVar28._8_8_ = dVar33 * (double)local_b8._8_8_;
  auVar32 = vshufpd_avx(local_118,local_118,1);
  auVar34 = vshufpd_avx(local_118,local_118,3);
  auVar34 = vfmadd132pd_fma(auVar34,auVar28,stack0xffffffffffffff60);
  auVar29._8_8_ = local_108;
  auVar29._0_8_ = local_108;
  auVar34 = vfmadd132pd_fma(auVar29,auVar34,local_88);
  lVar22 = 0x10;
  do {
    uVar14 = *(undefined8 *)(local_c8 + lVar22 + 8);
    puVar3 = (undefined8 *)
             ((long)(__return_storage_ptr__->
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.m_data.
                    array + lVar22 + -0x10);
    *puVar3 = *(undefined8 *)(local_c8 + lVar22);
    puVar3[1] = uVar14;
    *(undefined8 *)
     ((long)(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
            m_storage.m_data.array + lVar22) = *(undefined8 *)(local_b8 + lVar22);
    lVar22 = lVar22 + 0x18;
  } while (lVar22 != 0x58);
  auVar34 = vsubpd_avx(local_f8,auVar34);
  *(undefined1 (*) [16])
   ((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage
    .m_data.array + 9) = auVar34;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.
  m_data.array[0xb] =
       dVar31 / dVar30 -
       (dVar33 * (double)local_b8._16_8_ + auVar32._0_8_ * local_90 + local_108 * local_78);
  if (local_138.m_data != (double *)0x0) {
    free((void *)local_138.m_data[-1]);
  }
  return __return_storage_ptr__;
}

Assistant:

opengv::transformation_t
opengv::math::arun_complete(
    const points_t & p1,
    const points_t & p2 )
{
  assert(p1.size() == p2.size());

  //derive the centroid of the two point-clouds
  point_t pointsCenter1 = Eigen::Vector3d::Zero();
  point_t pointsCenter2 = Eigen::Vector3d::Zero();

  for( size_t i = 0; i < p1.size(); i++ )
  {
    pointsCenter1 += p1[i];
    pointsCenter2 += p2[i];
  }

  pointsCenter1 = pointsCenter1 / p1.size();
  pointsCenter2 = pointsCenter2 / p2.size();

  //compute the matrix H = sum(f'*f^{T})
  Eigen::MatrixXd Hcross(3,3);
  Hcross = Eigen::Matrix3d::Zero();

  for( size_t i = 0; i < p1.size(); i++ )
  {
    Eigen::Vector3d f = p1[i] - pointsCenter1;
    Eigen::Vector3d fprime = p2[i] - pointsCenter2;
    Hcross += fprime * f.transpose();
  }

  //decompose this matrix (SVD) to obtain rotation
  rotation_t rotation = arun(Hcross);
  translation_t translation = pointsCenter1 - rotation*pointsCenter2;
  transformation_t solution;
  solution.block<3,3>(0,0) = rotation;
  solution.col(3) = translation;

  return solution;
}